

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::ConstraintItemSyntax> *args_1;
  ConstraintBlockSyntax *pCVar1;
  Token local_40;
  Token local_30;
  
  local_30 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  args_1 = deepClone<slang::syntax::ConstraintItemSyntax>
                     ((SyntaxList<slang::syntax::ConstraintItemSyntax> *)(__fn + 0x28),
                      (BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x60),(BumpAllocator *)__child_stack);
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::ConstraintBlockSyntax,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::ConstraintItemSyntax>&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,&local_30,args_1,&local_40);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const ConstraintBlockSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ConstraintBlockSyntax>(
        node.openBrace.deepClone(alloc),
        *deepClone(node.items, alloc),
        node.closeBrace.deepClone(alloc)
    );
}